

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void soplex::enQueueMin(int *heap,int *size,int elem)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *size;
  *size = uVar1 + 1;
  while (0 < (int)uVar1) {
    uVar2 = uVar1 - 1 >> 1;
    if (heap[uVar2] <= elem) break;
    heap[uVar1] = heap[uVar2];
    uVar1 = uVar2;
  }
  heap[(int)uVar1] = elem;
  return;
}

Assistant:

static inline void enQueueMin(int* heap, int* size, int elem)
{
   int i, j;

   j = (*size)++;

   while(j > 0)
   {
      i = (j - 1) / 2;

      if(elem < heap[i])
      {
         heap[j] = heap[i];
         j = i;
      }
      else
         break;
   }

   heap[j] = elem;

#ifdef SOPLEX_DEBUG

   // no NDEBUG define, since this block is really expensive
   for(i = 1; i < *size; ++i)
      for(j = 0; j < i; ++j)
         assert(heap[i] != heap[j]);

#endif  /* SOPLEX_DEBUG */
}